

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall soul::ASTVisitor::visitObject(ASTVisitor *this,ModuleBase *t)

{
  ObjectType OVar1;
  allocator<char> local_39;
  string local_38;
  ModuleBase *local_18;
  ModuleBase *t_local;
  ASTVisitor *this_local;
  
  OVar1 = (t->super_ASTObject).objectType;
  local_18 = t;
  t_local = (ModuleBase *)this;
  if (OVar1 == Graph) {
    (*this->_vptr_ASTVisitor[7])(this,t);
  }
  else if (OVar1 == Processor) {
    (*this->_vptr_ASTVisitor[6])(this,t);
  }
  else {
    if (OVar1 != Namespace) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Unknown AST module",&local_39);
      throwInternalCompilerError(&local_38);
    }
    (*this->_vptr_ASTVisitor[8])(this,t);
  }
  return;
}

Assistant:

virtual void visitObject (AST::ModuleBase& t)
    {
        switch (t.objectType)
        {
            SOUL_AST_MODULES (SOUL_INVOKE_FOR_SUBCLASS)
            default: throwInternalCompilerError ("Unknown AST module"); break;
        }
    }